

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O0

bool __thiscall create::Serial::startReading(Serial *this)

{
  bool bVar1;
  uint uVar2;
  cv_status cVar3;
  ostream *poVar4;
  Opcode local_e4 [3];
  duration<long,_std::ratio<1L,_1000L>_> local_d8;
  int local_d0;
  int local_cc;
  int maxAttempts;
  int attempts;
  unique_lock<std::mutex> lock;
  code *local_b0;
  undefined8 local_a8;
  type local_a0;
  thread local_88 [3];
  enable_shared_from_this<create::Serial> local_70;
  code *local_60;
  undefined8 local_58;
  type local_50;
  mutable_buffer local_30;
  Opcode local_1c;
  Serial *local_18;
  Serial *this_local;
  
  local_18 = this;
  bVar1 = connected(this);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->data);
    if (bVar1) {
      if ((this->isReading & 1U) == 0) {
        local_1c = OC_START;
        sendOpcode(this,&local_1c);
        uVar2 = (**this->_vptr_Serial)();
        if ((uVar2 & 1) == 0) {
          this_local._7_1_ = 0;
        }
        else {
          boost::asio::io_context::reset(&this->io);
          local_30 = (mutable_buffer)boost::asio::buffer(&this->byteRead,1);
          local_60 = onData;
          local_58 = 0;
          std::enable_shared_from_this<create::Serial>::shared_from_this(&local_70);
          std::
          bind<void(create::Serial::*)(boost::system::error_code_const&,unsigned_long_const&),std::shared_ptr<create::Serial>,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                    (&local_50,(offset_in_Serial_to_subr *)&local_60,
                     (shared_ptr<create::Serial> *)&local_70,
                     (_Placeholder<1> *)&std::placeholders::_1,
                     (_Placeholder<2> *)&std::placeholders::_2);
          boost::asio::
          async_read<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(create::Serial::*(std::shared_ptr<create::Serial>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long_const&)>>
                    (&this->port,(mutable_buffers_1 *)&local_30,&local_50,(type *)0x0);
          std::
          _Bind<void_(create::Serial::*(std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_unsigned_long_&)>
          ::~_Bind(&local_50);
          std::shared_ptr<create::Serial>::~shared_ptr((shared_ptr<create::Serial> *)&local_70);
          local_b0 = boost::asio::io_context::run;
          local_a8 = 0;
          lock._8_8_ = &this->io;
          std::bind<unsigned_long(boost::asio::io_context::*)(),boost::asio::io_context*>
                    (&local_a0,(offset_in_io_context_to_subr *)&local_b0,
                     (io_context **)&lock._M_owns);
          std::thread::
          thread<std::_Bind<unsigned_long(boost::asio::io_context::*(boost::asio::io_context*))()>,,void>
                    (local_88,&local_a0);
          std::thread::operator=(&this->ioThread,local_88);
          std::thread::~thread(local_88);
          std::unique_lock<std::mutex>::unique_lock
                    ((unique_lock<std::mutex> *)&maxAttempts,&this->dataReadyMut);
          local_cc = 1;
          local_d0 = 10;
          while (((this->dataReady ^ 0xffU) & 1) != 0) {
            local_e4[2] = 500;
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                      ((duration<long,std::ratio<1l,1000l>> *)&local_d8,(int *)(local_e4 + 2));
            cVar3 = std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                              (&this->dataReadyCond,(unique_lock<std::mutex> *)&maxAttempts,
                               &local_d8);
            if (cVar3 == timeout) {
              if (local_d0 <= local_cc) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"[create::Serial] ");
                poVar4 = std::operator<<(poVar4,
                                         "failed to receive data from Create. Check if robot is powered!"
                                        );
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                boost::asio::io_context::stop(&this->io);
                std::thread::join();
                this_local._7_1_ = 0;
                goto LAB_001b01d6;
              }
              local_cc = local_cc + 1;
              local_e4[0] = OC_START;
              sendOpcode(this,local_e4);
              (**this->_vptr_Serial)();
            }
          }
          this->isReading = true;
          this_local._7_1_ = 1;
LAB_001b01d6:
          local_e4[1] = 1;
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&maxAttempts);
        }
      }
      else {
        this_local._7_1_ = 1;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"[create::Serial] ");
      poVar4 = std::operator<<(poVar4,"data pointer not initialized.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Serial::startReading() {
    if (!connected()) return false;

    if (!data) {
      CERR("[create::Serial] ", "data pointer not initialized.");
      return false;
    }

    // Only allow once
    if (isReading) return true;

    // Start OI
    sendOpcode(OC_START);

    if (!startSensorStream()) return false;

    io.reset();

    // Start continuously reading one byte at a time
    boost::asio::async_read(port,
                            boost::asio::buffer(&byteRead, 1),
                            std::bind(&Serial::onData,
                                      shared_from_this(),
                                      std::placeholders::_1,
                                      std::placeholders::_2));

    ioThread = std::thread(std::bind(
        static_cast<std::size_t(boost::asio::io_service::*)(void)>(
          &boost::asio::io_service::run), &io));

    // Wait for first complete read to finish
    std::unique_lock<std::mutex> lock(dataReadyMut);

    int attempts = 1;
    int maxAttempts = 10;
    while (!dataReady) {
      if (dataReadyCond.wait_for(lock, std::chrono::milliseconds(500)) == std::cv_status::timeout) {
        if (attempts >= maxAttempts) {
          CERR("[create::Serial] ", "failed to receive data from Create. Check if robot is powered!");
          io.stop();
          ioThread.join();
          return false;
        }
        attempts++;

        // Request data again
        sendOpcode(OC_START);
        startSensorStream();
      }
    }

    isReading = true;
    return true;
  }